

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_top(Parser *this)

{
  code *pcVar1;
  csubstr rem_00;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  size_t ahead;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  csubstr fmt;
  csubstr rem;
  csubstr trimmed;
  
  rem.str = (this->m_state->line_contents).rem.str;
  rem.len = (this->m_state->line_contents).rem.len;
  if ((rem.len == 0) || (*rem.str != '#')) {
    trimmed = basic_substring<const_char>::triml(&rem,' ');
    if ((trimmed.len == 0) || (*trimmed.str != '%')) {
      pattern.len = 4;
      pattern.str = "--- ";
      bVar2 = basic_substring<const_char>::begins_with(&trimmed,pattern);
      if (((bVar2) || (iVar4 = basic_substring<const_char>::compare(&trimmed,"---",3), iVar4 == 0))
         || (pattern_00.len = 4, pattern_00.str = "---\t",
            bVar2 = basic_substring<const_char>::begins_with(&trimmed,pattern_00), bVar2)) {
        rem_00.len = rem.len;
        rem_00.str = rem.str;
        _start_new_doc(this,rem_00);
        if (rem.len < trimmed.len || rem.len - trimmed.len == 0) {
          return true;
        }
        _line_progressed(this,rem.len - trimmed.len);
        _save_indentation(this,0);
        return true;
      }
      pattern_01.len = 3;
      pattern_01.str = "...";
      bVar2 = basic_substring<const_char>::begins_with(&trimmed,pattern_01);
      if (!bVar2) {
        bVar2 = is_debugger_attached();
        if ((bVar2) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          uVar3 = (*pcVar1)();
          return (bool)uVar3;
        }
        fmt.len = 0x12;
        fmt.str = "ERROR: parse error";
        _err<>(this,fmt);
        return false;
      }
      _end_stream(this);
      if (trimmed.len <= rem.len && rem.len - trimmed.len != 0) {
        _line_progressed(this,rem.len - trimmed.len);
      }
      ahead = 3;
    }
    else {
      _handle_directive(this,trimmed);
      ahead = rem.len;
    }
    _line_progressed(this,ahead);
  }
  else {
    _scan_comment(this);
  }
  return true;
}

Assistant:

bool Parser::_handle_top()
{
    _c4dbgp("handle_top");
    csubstr rem = m_state->line_contents.rem;

    if(rem.begins_with('#'))
    {
        _c4dbgp("a comment line");
        _scan_comment();
        return true;
    }

    csubstr trimmed = rem.triml(' ');

    if(trimmed.begins_with('%'))
    {
        _handle_directive(trimmed);
        _line_progressed(rem.len);
        return true;
    }
    else if(trimmed.begins_with("--- ") || trimmed == "---" || trimmed.begins_with("---\t"))
    {
        _start_new_doc(rem);
        if(trimmed.len < rem.len)
        {
            _line_progressed(rem.len - trimmed.len);
            _save_indentation();
        }
        return true;
    }
    else if(trimmed.begins_with("..."))
    {
        _c4dbgp("end current document");
        _end_stream();
        if(trimmed.len < rem.len)
        {
            _line_progressed(rem.len - trimmed.len);
        }
        _line_progressed(3);
        return true;
    }
    else
    {
        _c4err("parse error");
    }

    return false;
}